

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

Vec_Wec_t * Abc_NtkDetectFinClasses(Abc_Ntk_t *pNtk,int fVerbose)

{
  void *pvVar1;
  Abc_Ntk_t *pNtk_00;
  uint uVar2;
  char *pcVar3;
  Vec_Wec_t *__ptr;
  Vec_Int_t *vCis;
  int *piVar4;
  Vec_Int_t *vNodes;
  Vec_Wec_t *vMap2;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *vResult;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vList;
  uint uVar7;
  long lVar8;
  Vec_Int_t *vCos;
  char *__format;
  ulong uVar9;
  int iVar10;
  long lVar11;
  Vec_Int_t *local_a0;
  Vec_Wec_t *vCoSets;
  Vec_Wec_t *vMap;
  Vec_Int_t *local_68;
  Vec_Wec_t *local_60;
  Vec_Wec_t *local_58;
  ulong local_50;
  Vec_Int_t *local_48;
  Abc_Ntk_t *local_40;
  Vec_Int_t *local_38;
  
  if (pNtk->vFins == (Vec_Int_t *)0x0) {
    puts("Current network does not have the required info.");
    return (Vec_Wec_t *)0x0;
  }
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    if (pNtk->ntkType != ABC_NTK_LOGIC) goto LAB_002ab616;
    uVar2 = Abc_NtkFinCheckTypesOk2(pNtk);
    if (uVar2 != 0) {
      if (((int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) goto LAB_002ab635;
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar2]);
      __format = 
      "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n"
      ;
      goto LAB_002ab152;
    }
    local_a0 = (Vec_Int_t *)0x0;
  }
  else {
    if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
LAB_002ab616:
      __assert_fail("Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x47d,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
    }
    uVar2 = Abc_NtkFinCheckTypesOk(pNtk);
    if (uVar2 != 0) {
      if (((int)uVar2 < 0) || (pNtk->vObjs->nSize <= (int)uVar2)) {
LAB_002ab635:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk->vObjs->pArray[uVar2]);
      __format = "Current network contains unsupported gate types (for example, see node \"%s\").\n"
      ;
LAB_002ab152:
      printf(__format,pcVar3);
      return (Vec_Wec_t *)0x0;
    }
    local_a0 = Abc_NtkFinComputeTypes(pNtk);
  }
  local_48 = pNtk->vFins;
  local_68 = Abc_NtkFinComputeObjects(local_48,&vMap,pNtk->vObjs->nSize);
  __ptr = Abc_NtkDetectObjClasses(pNtk,local_68,&vCoSets);
  vCis = (Vec_Int_t *)malloc(0x10);
  vCis->nCap = 1000;
  vCis->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vCis->pArray = piVar4;
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vNodes->pArray = piVar4;
  uVar2 = pNtk->vObjs->nSize;
  vMap2 = (Vec_Wec_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar2 - 1) {
    uVar7 = uVar2;
  }
  vMap2->nCap = uVar7;
  iVar10 = 0;
  local_40 = pNtk;
  if (uVar7 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)(int)uVar7,0x10);
  }
  vMap2->pArray = pVVar5;
  vMap2->nSize = uVar2;
  vResult = (Vec_Wec_t *)malloc(0x10);
  vResult->nCap = 1000;
  vResult->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(1000,0x10);
  vResult->pArray = pVVar6;
  local_50 = (ulong)__ptr->nSize;
  if (0 < (long)local_50) {
    pVVar6 = __ptr->pArray;
    lVar8 = 4;
    local_60 = vMap;
    uVar9 = 0;
    local_58 = vCoSets;
    do {
      pNtk_00 = local_40;
      if ((long)local_58->nSize <= (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_38 = local_58->pArray;
      vCos = (Vec_Int_t *)((long)local_38 + lVar8 + -4);
      Abc_NtkFinMiterCollect(local_40,vCos,vCis,vNodes);
      vList = Abc_NtkFinCreateList(local_60,pVVar6);
      uVar2 = Abc_NtkFinRefinement(pNtk_00,local_a0,vCos,vCis,vNodes,local_48,vList,vMap2,vResult);
      if (fVerbose != 0) {
        printf("Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n",
               uVar9 & 0xffffffff,(ulong)(uint)pVVar6->nSize,(ulong)(uint)vList->nSize,
               (ulong)(uint)vCis->nSize,(ulong)*(uint *)((long)&local_38->nCap + lVar8),
               (ulong)(uint)vNodes->nSize,(ulong)uVar2);
      }
      if (vList->pArray != (int *)0x0) {
        free(vList->pArray);
      }
      free(vList);
      uVar9 = uVar9 + 1;
      pVVar6 = pVVar6 + 1;
      lVar8 = lVar8 + 0x10;
    } while (local_50 != uVar9);
    iVar10 = vResult->nSize;
    pVVar6 = vResult->pArray;
    if (0 < (long)iVar10) {
      lVar8 = 0;
      do {
        qsort(*(void **)((long)&pVVar6->pArray + lVar8),(long)*(int *)((long)&pVVar6->nSize + lVar8)
              ,4,Vec_IntSortCompare1);
        lVar8 = lVar8 + 0x10;
      } while ((long)iVar10 << 4 != lVar8);
    }
  }
  qsort(pVVar6,(long)iVar10,0x10,Vec_WecSortCompare3);
  if (local_a0 != (Vec_Int_t *)0x0) {
    if (local_a0->pArray != (int *)0x0) {
      free(local_a0->pArray);
    }
    free(local_a0);
  }
  pVVar6 = local_68;
  if (local_68->pArray != (int *)0x0) {
    free(local_68->pArray);
  }
  free(pVVar6);
  iVar10 = __ptr->nCap;
  pVVar6 = __ptr->pArray;
  if ((long)iVar10 < 1) {
    if (pVVar6 != (Vec_Int_t *)0x0) goto LAB_002ab495;
  }
  else {
    lVar8 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar6->pArray + lVar8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&pVVar6->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar10 * 0x10 != lVar8);
LAB_002ab495:
    free(pVVar6);
  }
  free(__ptr);
  iVar10 = vMap->nCap;
  pVVar6 = vMap->pArray;
  if (iVar10 < 1) {
    if (pVVar6 != (Vec_Int_t *)0x0) goto LAB_002ab4f9;
  }
  else {
    lVar8 = 8;
    lVar11 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar6->nCap + lVar8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar6 = vMap->pArray;
        *(undefined8 *)((long)&pVVar6->nCap + lVar8) = 0;
        iVar10 = vMap->nCap;
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar11 < iVar10);
LAB_002ab4f9:
    free(pVVar6);
    uVar7 = vMap2->nCap;
    pVVar5 = vMap2->pArray;
  }
  free(vMap);
  if ((int)uVar7 < 1) {
    if (pVVar5 != (Vec_Int_t *)0x0) goto LAB_002ab545;
  }
  else {
    lVar8 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar5->pArray + lVar8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&pVVar5->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar8);
LAB_002ab545:
    free(pVVar5);
  }
  free(vMap2);
  iVar10 = vCoSets->nCap;
  pVVar5 = vCoSets->pArray;
  if (iVar10 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_002ab5a9;
  }
  else {
    lVar8 = 8;
    lVar11 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar5->nCap + lVar8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar5 = vCoSets->pArray;
        *(undefined8 *)((long)&pVVar5->nCap + lVar8) = 0;
        iVar10 = vCoSets->nCap;
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar11 < iVar10);
  }
  free(pVVar5);
LAB_002ab5a9:
  free(vCoSets);
  if (vCis->pArray != (int *)0x0) {
    free(vCis->pArray);
  }
  free(vCis);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return vResult;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectFinClasses( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTypes = NULL; // gate types
    Vec_Int_t * vPairs;        // original info as a set of pairs (ObjId, TypeId)
    Vec_Int_t * vObjs;         // all those objects that have some fin 
    Vec_Wec_t * vMap;          // for each object, the set of fins
    Vec_Wec_t * vMap2;         // for each local object, the set of pairs (Info, Index)
    Vec_Wec_t * vClasses;      // classes of objects
    Vec_Wec_t * vCoSets;       // corresponding CO sets
    Vec_Int_t * vClass;        // one class
    Vec_Int_t * vCoSet;        // one set of COs
    Vec_Int_t * vCiSet;        // one set of CIs
    Vec_Int_t * vNodeSet;      // one set of nodes
    Vec_Int_t * vList;         // one info list
    Vec_Wec_t * vResult;       // resulting equivalences
    int i, iObj, nCalls;
    if ( pNtk->vFins == NULL )
    {
        printf( "Current network does not have the required info.\n" );
        return NULL;
    }
    assert( Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk) );
    if ( Abc_NtkIsSopLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk(pNtk);
        if ( iObj )
        {
            printf( "Current network contains unsupported gate types (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
        vTypes   = Abc_NtkFinComputeTypes( pNtk );
    }
    else if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk2(pNtk);
        if ( iObj )
        {
            printf( "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
    }
    else assert( 0 );
    //Abc_NtkFrameExtend( pNtk );
    // collect data
    vPairs   = pNtk->vFins;
    vObjs    = Abc_NtkFinComputeObjects( vPairs, &vMap, Abc_NtkObjNumMax(pNtk) );
    vClasses = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCoSets );
    // refine classes
    vCiSet   = Vec_IntAlloc( 1000 );
    vNodeSet = Vec_IntAlloc( 1000 );
    vMap2    = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    vResult  = Vec_WecAlloc( 1000 );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        // extract one window
        vCoSet = Vec_WecEntry( vCoSets, i );
        Abc_NtkFinMiterCollect( pNtk, vCoSet, vCiSet, vNodeSet );
        // refine one class
        vList = Abc_NtkFinCreateList( vMap, vClass );
        nCalls = Abc_NtkFinRefinement( pNtk, vTypes, vCoSet, vCiSet, vNodeSet, vPairs, vList, vMap2, vResult );
        if ( fVerbose )
            printf( "Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n", 
                i, Vec_IntSize(vClass), Vec_IntSize(vList), Vec_IntSize(vCiSet), Vec_IntSize(vCoSet), Vec_IntSize(vNodeSet), nCalls );
        Vec_IntFree( vList );
    }
    // sort entries in each array
    Vec_WecForEachLevel( vResult, vClass, i )
        Vec_IntSort( vClass, 0 );
    // sort by the index of the first entry
    Vec_WecSortByFirstInt( vResult, 0 ); 
    // cleanup
    Vec_IntFreeP( & vTypes );
    Vec_IntFree( vObjs );
    Vec_WecFree( vClasses );
    Vec_WecFree( vMap );
    Vec_WecFree( vMap2 );
    Vec_WecFree( vCoSets );
    Vec_IntFree( vCiSet );
    Vec_IntFree( vNodeSet );
    return vResult;
}